

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funck(lua_State *L)

{
  int32_t iVar1;
  GCproto *pGVar2;
  ulong uVar3;
  GCobj *gc;
  ptrdiff_t idx;
  GCproto *pt;
  lua_State *L_local;
  
  pGVar2 = check_Lproto(L,0);
  iVar1 = lj_lib_checkint(L,2);
  uVar3 = (ulong)iVar1;
  if ((long)uVar3 < 0) {
    if ((long)(uVar3 ^ 0xffffffffffffffff) < (long)(ulong)pGVar2->sizekgc) {
      uVar3 = *(ulong *)((pGVar2->k).ptr64 + uVar3 * 8);
      L->top[-1].u64 = uVar3 | (ulong)(*(byte *)(uVar3 + 9) ^ 0xffffffff) << 0x2f;
      return 1;
    }
  }
  else if ((long)uVar3 < (long)(ulong)pGVar2->sizekn) {
    L->top[-1] = *(TValue *)((pGVar2->k).ptr64 + uVar3 * 8);
    return 1;
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_util_funck)
{
  GCproto *pt = check_Lproto(L, 0);
  ptrdiff_t idx = (ptrdiff_t)lj_lib_checkint(L, 2);
  if (idx >= 0) {
    if (idx < (ptrdiff_t)pt->sizekn) {
      copyTV(L, L->top-1, proto_knumtv(pt, idx));
      return 1;
    }
  } else {
    if (~idx < (ptrdiff_t)pt->sizekgc) {
      GCobj *gc = proto_kgc(pt, idx);
      setgcV(L, L->top-1, gc, ~gc->gch.gct);
      return 1;
    }
  }
  return 0;
}